

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O3

void amrex::EB_set_covered(MultiFab *mf,int icomp,int ncomp,int ngrow,Real val)

{
  int iVar1;
  FabArray<amrex::FArrayBox> *this;
  BATType BVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint32_t *puVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  MFIter mfi;
  uint local_21c;
  int local_1f4;
  Box local_1bc;
  long local_1a0;
  Real local_198;
  ulong local_190;
  long local_188;
  long local_180;
  FabArray<amrex::FArrayBox> *local_178;
  FabArray<amrex::EBCellFlagFab> *local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  long local_150;
  uint32_t *local_148;
  uint32_t *local_140;
  ulong local_138;
  long local_130;
  long local_128;
  EBCellFlag *local_120;
  long local_118;
  Array4<double> local_110;
  Array4<const_amrex::EBCellFlag> local_d0;
  MFIter local_90;
  
  local_198 = val;
  lVar3 = __dynamic_cast((mf->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar3 == 0) {
    return;
  }
  local_170 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar3 + 0xd8));
  BVar2 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
  lVar3 = 0xc;
  switch(BVar2) {
  case null:
  case coarsenRatio:
    goto switchD_004d9a82_caseD_0;
  case indexType:
  case indexType_coarsenRatio:
    break;
  default:
    lVar3 = 0x10;
  }
  if (*(int *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase +
              lVar3) == 0) goto switchD_004d9a82_caseD_0;
  lVar3 = 0xc;
  if (BVar2 == indexType) {
LAB_004d9aa9:
    if (*(int *)((long)&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase
                + lVar3) == 7) goto switchD_004d9a82_caseD_0;
  }
  else if (BVar2 != coarsenRatio) {
    if (BVar2 != indexType_coarsenRatio) {
      lVar3 = 0x10;
    }
    goto LAB_004d9aa9;
  }
  Assert_host("mf.ixType().cellCentered() || mf.ixType().nodeCentered()",
              "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EBMultiFabUtil.cpp"
              ,0x21,(char *)0x0);
  BVar2 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_bat_type;
switchD_004d9a82_caseD_0:
  local_21c = 0;
  switch(BVar2) {
  case null:
  case coarsenRatio:
    break;
  case indexType:
  case indexType_coarsenRatio:
    local_21c = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                m_indexType.m_typ.itype;
    break;
  default:
    local_21c = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ.itype;
  }
  iVar1 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
  if (iVar1 < ngrow) {
    ngrow = iVar1;
  }
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_190 = (ulong)(uint)ncomp;
    local_1a0 = (long)icomp << 3;
    local_178 = &mf->super_FabArray<amrex::FArrayBox>;
    do {
      this = local_178;
      MFIter::growntilebox(&local_1bc,&local_90,ngrow);
      FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_d0,local_170,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this,&local_90);
      if (local_21c == 0) {
        if (0 < ncomp) {
          uVar6 = 0;
          lVar3 = local_1a0;
          do {
            iVar1 = local_1bc.smallend.vect[2];
            if (local_1bc.smallend.vect[2] <= local_1bc.bigend.vect[2]) {
              do {
                if (local_1bc.smallend.vect[1] <= local_1bc.bigend.vect[1]) {
                  puVar11 = (uint32_t *)
                            ((long)&local_d0.p
                                    [(long)local_1bc.smallend.vect[0] +
                                     (((long)iVar1 - (long)local_d0.begin.z) * local_d0.kstride -
                                     (long)local_d0.begin.x)].flag +
                            ((long)local_1bc.smallend.vect[1] - (long)local_d0.begin.y) *
                            local_d0.jstride * 4);
                  lVar16 = (long)local_1bc.smallend.vect[1];
                  do {
                    if (local_1bc.smallend.vect[0] <= local_1bc.bigend.vect[0]) {
                      lVar5 = 0;
                      do {
                        if ((~puVar11[lVar5] & 3) == 0) {
                          *(Real *)((long)local_110.p +
                                   lVar5 * 8 +
                                   local_110.nstride * lVar3 +
                                   ((long)iVar1 - (long)local_110.begin.z) * local_110.kstride * 8 +
                                   (lVar16 - local_110.begin.y) * local_110.jstride * 8 +
                                   (long)local_110.begin.x * -8 +
                                   (long)local_1bc.smallend.vect[0] * 8) = local_198;
                        }
                        lVar5 = lVar5 + 1;
                      } while ((local_1bc.bigend.vect[0] - local_1bc.smallend.vect[0]) + 1 !=
                               (int)lVar5);
                    }
                    lVar16 = lVar16 + 1;
                    puVar11 = puVar11 + local_d0.jstride;
                  } while (local_1bc.bigend.vect[1] + 1U != (int)lVar16);
                }
                bVar17 = iVar1 != local_1bc.bigend.vect[2];
                iVar1 = iVar1 + 1;
              } while (bVar17);
            }
            uVar6 = uVar6 + 1;
            lVar3 = lVar3 + 8;
          } while (uVar6 != local_190);
        }
      }
      else if (0 < ncomp) {
        local_158 = (ulong)(uint)local_1bc.bigend.vect[1];
        local_188 = (long)local_1bc.smallend.vect[1];
        lVar3 = (long)local_1bc.smallend.vect[0];
        local_160 = lVar3 * 4;
        local_150 = lVar3 * 8;
        local_180 = local_1a0;
        uVar6 = 0;
        do {
          local_168 = uVar6;
          local_1f4 = local_1bc.smallend.vect[2] + -1;
          iVar1 = local_1bc.smallend.vect[2];
          if (local_1bc.smallend.vect[2] <= local_1bc.bigend.vect[2]) {
            do {
              if (local_1bc.smallend.vect[1] <= local_1bc.bigend.vect[1]) {
                local_118 = (long)iVar1;
                lVar7 = (long)local_d0.begin.x;
                local_130 = (long)local_d0.begin.y;
                local_138 = (ulong)(uint)~local_d0.begin.y;
                lVar13 = (~local_d0.begin.z + iVar1) * local_d0.kstride;
                lVar4 = (iVar1 - local_d0.begin.z) * local_d0.kstride;
                local_120 = local_d0.p;
                lVar10 = (local_118 - local_d0.begin.z) * local_d0.kstride * 4;
                local_140 = (uint32_t *)((long)&local_d0.p[lVar3 - lVar7].flag + lVar10);
                local_128 = local_d0.jstride;
                lVar16 = local_d0.jstride * 4;
                lVar5 = (long)(local_1f4 - local_d0.begin.z) * local_d0.kstride * 4;
                lVar12 = (local_188 - local_130) * lVar16;
                iVar9 = (local_1bc.smallend.vect[1] + -1) - local_d0.begin.y;
                local_148 = (uint32_t *)((long)&local_d0.p[lVar3 - lVar7].flag + lVar5);
                lVar10 = (long)&local_d0.p[lVar3 - lVar7].flag + lVar10 + lVar12;
                lVar7 = (long)&local_d0.p[lVar3 - lVar7].flag + lVar12 + lVar5;
                lVar5 = local_188;
                do {
                  if (local_1bc.smallend.vect[0] <= local_1bc.bigend.vect[0]) {
                    lVar12 = (~local_d0.begin.y + (int)lVar5) * local_d0.jstride;
                    lVar8 = (lVar5 - local_130) * local_d0.jstride;
                    lVar15 = 0;
                    do {
                      lVar14 = (long)(((local_1bc.smallend.vect[0] + -1) - local_d0.begin.x) +
                                     (int)lVar15);
                      if ((((((~local_d0.p[lVar12 + lVar14 + lVar13].flag & 3) == 0) &&
                            ((~*(uint *)((long)local_148 + lVar15 * 4 + iVar9 * lVar16) & 3) == 0))
                           && ((~local_d0.p[lVar8 + lVar14 + lVar13].flag & 3) == 0)) &&
                          (((~*(uint *)(lVar7 + lVar15 * 4) & 3) == 0 &&
                           ((~local_d0.p[lVar12 + lVar14 + lVar4].flag & 3) == 0)))) &&
                         (((~*(uint *)((long)local_140 + lVar15 * 4 + iVar9 * lVar16) & 3) == 0 &&
                          (((~local_d0.p[lVar8 + lVar14 + lVar4].flag & 3) == 0 &&
                           ((~*(uint *)(lVar10 + lVar15 * 4) & 3) == 0)))))) {
                        *(Real *)((long)local_110.p +
                                 lVar15 * 8 +
                                 local_110.nstride * local_180 +
                                 (local_118 - local_110.begin.z) * local_110.kstride * 8 +
                                 (lVar5 - local_110.begin.y) * local_110.jstride * 8 +
                                 (long)local_110.begin.x * -8 + local_150) = local_198;
                      }
                      lVar15 = lVar15 + 1;
                    } while ((local_1bc.bigend.vect[0] - local_1bc.smallend.vect[0]) + 1 !=
                             (int)lVar15);
                  }
                  lVar5 = lVar5 + 1;
                  iVar9 = iVar9 + 1;
                  lVar10 = lVar10 + lVar16;
                  lVar7 = lVar7 + lVar16;
                } while (local_1bc.bigend.vect[1] + 1U != (int)lVar5);
              }
              bVar17 = iVar1 != local_1bc.bigend.vect[2];
              local_1f4 = local_1f4 + 1;
              iVar1 = iVar1 + 1;
            } while (bVar17);
          }
          local_180 = local_180 + 8;
          uVar6 = local_168 + 1;
        } while (local_168 + 1 != local_190);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
EB_set_covered (MultiFab& mf, int icomp, int ncomp, int ngrow, Real val)
{
    const auto factory = dynamic_cast<EBFArrayBoxFactory const*>(&(mf.Factory()));
    if (factory == nullptr) return;
    const auto& flags = factory->getMultiEBCellFlagFab();

    AMREX_ALWAYS_ASSERT(mf.ixType().cellCentered() || mf.ixType().nodeCentered());
    bool is_cell_centered = mf.ixType().cellCentered();
    int ng = std::min(mf.nGrow(),ngrow);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.growntilebox(ng);
        const auto& flagarr = flags.const_array(mfi);
        Array4<Real> const& arr = mf.array(mfi);

        if (is_cell_centered) {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                if (flagarr(i,j,k).isCovered()) {
                    arr(i,j,k,n+icomp) = val;
                }
            });
        } else {
            AMREX_HOST_DEVICE_FOR_4D (bx, ncomp, i, j, k, n,
            {
                eb_set_covered_nodes(i,j,k,n,icomp,arr,flagarr,val);
            });
        }
    }
}